

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::~CopyingOutputStreamAdaptor
          (CopyingOutputStreamAdaptor *this)

{
  ~CopyingOutputStreamAdaptor(this);
  operator_delete(this);
  return;
}

Assistant:

CopyingOutputStreamAdaptor::~CopyingOutputStreamAdaptor() {
  WriteBuffer();
  if (owns_copying_stream_) {
    delete copying_stream_;
  }
}